

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O3

QVariant * __thiscall
QGraphicsWidget::itemChange
          (QVariant *__return_storage_ptr__,QGraphicsWidget *this,GraphicsItemChange change,
          QVariant *value)

{
  QGraphicsWidgetPrivate *this_00;
  char cVar1;
  Type TVar2;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0x12 < change - ItemVisibleChange) goto switchD_0063bcfe_caseD_3;
  this_00 = *(QGraphicsWidgetPrivate **)(this + 0x18);
  switch(change) {
  case ItemVisibleChange:
    cVar1 = ::QVariant::toBool();
    if (cVar1 != '\0') {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      QShowEvent::QShowEvent((QShowEvent *)&local_48);
      QCoreApplication::sendEvent((QObject *)this,(QEvent *)&local_48);
      if ((*(byte *)(*(long *)(this + 0x18) + 0x1b4) & 8) == 0) {
        adjustSize(this);
        *(ushort *)(*(long *)(this + 0x18) + 0x1b4) =
             *(ushort *)(*(long *)(this + 0x18) + 0x1b4) & 0xfff7;
      }
      QShowEvent::~QShowEvent((QShowEvent *)&local_48);
    }
    cVar1 = ::QVariant::toBool();
    if ((cVar1 != '\0') || (((this_00->super_QGraphicsItemPrivate).field_0x160 & 0x40) != 0)) {
      (**(code **)(*(long *)this + 0xa8))(this);
    }
  default:
    goto switchD_0063bcfe_caseD_3;
  case ItemParentChange:
    TVar2 = ParentAboutToChange;
    break;
  case ItemPositionHasChanged:
    QGraphicsWidgetPrivate::setGeometryFromSetPos(this_00);
    goto switchD_0063bcfe_caseD_3;
  case ItemVisibleHasChanged:
    cVar1 = ::QVariant::toBool();
    if (cVar1 == '\0') {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      QHideEvent::QHideEvent((QHideEvent *)&local_48);
      QCoreApplication::sendEvent((QObject *)this,(QEvent *)&local_48);
      QHideEvent::~QHideEvent((QHideEvent *)&local_48);
    }
    goto switchD_0063bcfe_caseD_3;
  case ItemEnabledHasChanged:
    TVar2 = EnabledChange;
    break;
  case ItemParentHasChanged:
    TVar2 = ParentChange;
    break;
  case ItemCursorHasChanged:
    TVar2 = CursorChange;
    break;
  case ItemToolTipHasChanged:
    TVar2 = ToolTipChange;
  }
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_48,TVar2);
  QCoreApplication::sendEvent((QObject *)this,(QEvent *)&local_48);
  QEvent::~QEvent((QEvent *)&local_48);
switchD_0063bcfe_caseD_3:
  QGraphicsItem::itemChange(__return_storage_ptr__,(QGraphicsItem *)(this + 0x10),change,value);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGraphicsWidget::itemChange(GraphicsItemChange change, const QVariant &value)
{
    Q_D(QGraphicsWidget);
    switch (change) {
    case ItemEnabledHasChanged: {
        // Send EnabledChange after the enabled state has changed.
        QEvent event(QEvent::EnabledChange);
        QCoreApplication::sendEvent(this, &event);
        break;
    }
    case ItemVisibleChange:
        if (value.toBool()) {
            // Send Show event before the item has been shown.
            QShowEvent event;
            QCoreApplication::sendEvent(this, &event);
            bool resized = testAttribute(Qt::WA_Resized);
            if (!resized) {
                adjustSize();
                setAttribute(Qt::WA_Resized, false);
            }
        }

        // layout size hint only changes if an item changes from/to explicitly hidden state
        if (value.toBool() || d->explicitlyHidden)
            updateGeometry();
        break;
    case ItemVisibleHasChanged:
        if (!value.toBool()) {
            // Send Hide event after the item has been hidden.
            QHideEvent event;
            QCoreApplication::sendEvent(this, &event);
        }
        break;
    case ItemPositionHasChanged:
        d->setGeometryFromSetPos();
        break;
    case ItemParentChange: {
        // Deliver ParentAboutToChange.
        QEvent event(QEvent::ParentAboutToChange);
        QCoreApplication::sendEvent(this, &event);
        break;
    }
    case ItemParentHasChanged: {
        // Deliver ParentChange.
        QEvent event(QEvent::ParentChange);
        QCoreApplication::sendEvent(this, &event);
        break;
    }
    case ItemCursorHasChanged: {
        // Deliver CursorChange.
        QEvent event(QEvent::CursorChange);
        QCoreApplication::sendEvent(this, &event);
        break;
    }
    case ItemToolTipHasChanged: {
        // Deliver ToolTipChange.
        QEvent event(QEvent::ToolTipChange);
        QCoreApplication::sendEvent(this, &event);
        break;
    }
    default:
        break;
    }
    return QGraphicsItem::itemChange(change, value);
}